

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

bool __thiscall LiteScript::Character::operator!=(Character *this,String *str)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  bool bVar4;
  String local_30;
  
  String::String(&local_30,(this->str->str)._M_dataplus._M_p[this->i]);
  uVar1 = (str->str)._M_string_length;
  sVar2 = local_30.str._M_string_length;
  if (uVar1 < local_30.str._M_string_length) {
    sVar2 = uVar1;
  }
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      if ((str->str)._M_dataplus._M_p[uVar3] != local_30.str._M_dataplus._M_p[uVar3]) {
        bVar4 = true;
        goto LAB_0013d5c3;
      }
      uVar3 = uVar3 + 1;
    } while (sVar2 != uVar3);
  }
  bVar4 = local_30.str._M_string_length != uVar1;
LAB_0013d5c3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
    operator_delete(local_30.str._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool LiteScript::Character::operator!=(const LiteScript::String& str) const {
    return (String(this->str[i]) != str);
}